

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::Path>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pPVar2;
  pointer pPVar3;
  StreamReader *pSVar4;
  bool bVar5;
  ulong uVar6;
  pointer this_00;
  int iVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  Path value;
  char c;
  Path local_120;
  string local_50;
  
  pPVar2 = (result->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar3 = (result->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pPVar2;
  if (pPVar3 != pPVar2) {
    do {
      Path::~Path(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pPVar3);
    (result->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
    super__Vector_impl_data._M_finish = pPVar2;
  }
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (bVar5) {
    local_120._prim_part._M_dataplus._M_p = (pointer)&local_120._prim_part.field_2;
    local_120._prim_part._M_string_length = 0;
    local_120._prim_part.field_2._M_local_buf[0] = '\0';
    local_120._prop_part._M_dataplus._M_p = (pointer)&local_120._prop_part.field_2;
    local_120._prop_part._M_string_length = 0;
    local_120._prop_part.field_2._M_local_buf[0] = '\0';
    local_120._variant_part._M_dataplus._M_p = (pointer)&local_120._variant_part.field_2;
    local_120._variant_part._M_string_length = 0;
    local_120._variant_part.field_2._M_local_buf[0] = '\0';
    local_120._variant_selection_part._M_dataplus._M_p =
         (pointer)&local_120._variant_selection_part.field_2;
    local_120._variant_selection_part._M_string_length = 0;
    local_120._variant_selection_part.field_2._M_local_buf[0] = '\0';
    local_120._variant_part_str._M_dataplus._M_p = (pointer)&local_120._variant_part_str.field_2;
    local_120._variant_part_str._M_string_length = 0;
    local_120._variant_part_str.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_120._element.field_2;
    local_120._element._M_string_length = 0;
    local_120._element.field_2._M_local_buf[0] = '\0';
    local_120._path_type.has_value_ = false;
    local_120._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    local_120._valid = false;
    local_120._element._M_dataplus._M_p = (pointer)paVar1;
    bVar5 = ReadBasicType(this,&local_120);
    if (bVar5) {
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back(result,&local_120);
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Not starting with the value of requested type.\n","");
      PushError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    paVar8 = &local_120._prim_part.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._element._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._element._M_dataplus._M_p,
                      CONCAT71(local_120._element.field_2._M_allocated_capacity._1_7_,
                               local_120._element.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._variant_part_str._M_dataplus._M_p != &local_120._variant_part_str.field_2) {
      operator_delete(local_120._variant_part_str._M_dataplus._M_p,
                      CONCAT71(local_120._variant_part_str.field_2._M_allocated_capacity._1_7_,
                               local_120._variant_part_str.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._variant_selection_part._M_dataplus._M_p !=
        &local_120._variant_selection_part.field_2) {
      operator_delete(local_120._variant_selection_part._M_dataplus._M_p,
                      CONCAT71(local_120._variant_selection_part.field_2._M_allocated_capacity._1_7_
                               ,local_120._variant_selection_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._variant_part._M_dataplus._M_p != &local_120._variant_part.field_2) {
      operator_delete(local_120._variant_part._M_dataplus._M_p,
                      CONCAT71(local_120._variant_part.field_2._M_allocated_capacity._1_7_,
                               local_120._variant_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._prop_part._M_dataplus._M_p != &local_120._prop_part.field_2) {
      operator_delete(local_120._prop_part._M_dataplus._M_p,
                      CONCAT71(local_120._prop_part.field_2._M_allocated_capacity._1_7_,
                               local_120._prop_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._prim_part._M_dataplus._M_p != paVar8) {
      operator_delete(local_120._prim_part._M_dataplus._M_p,
                      CONCAT71(local_120._prim_part.field_2._M_allocated_capacity._1_7_,
                               local_120._prim_part.field_2._M_local_buf[0]) + 1);
    }
    if (bVar5) {
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_003bdef8;
        bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        bVar5 = Char1(this,(char *)&local_50);
        if (!bVar5) {
          return false;
        }
        if ((char)local_50._M_dataplus._M_p == sep) {
          bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar5) {
            return false;
          }
          bVar5 = LookChar1(this,(char *)&local_120);
          if (!bVar5) {
            return false;
          }
          iVar7 = 3;
          if ((char)local_120._prim_part._M_dataplus._M_p != end_symbol) {
            goto LAB_003bdd3f;
          }
        }
        else {
LAB_003bdd3f:
          if ((char)local_50._M_dataplus._M_p != sep) {
            pSVar4 = this->_sr;
            if ((0 < (long)pSVar4->idx_) && (uVar6 = pSVar4->idx_ - 1, uVar6 <= pSVar4->length_)) {
              pSVar4->idx_ = uVar6;
            }
            goto LAB_003bdef8;
          }
          bVar5 = SkipWhitespaceAndNewline(this,true);
          if (!bVar5) {
            return false;
          }
          local_120._prim_part._M_string_length = 0;
          local_120._prim_part.field_2._M_local_buf[0] = '\0';
          local_120._prop_part._M_dataplus._M_p = (pointer)&local_120._prop_part.field_2;
          local_120._prop_part._M_string_length = 0;
          local_120._prop_part.field_2._M_local_buf[0] = '\0';
          local_120._variant_part._M_dataplus._M_p = (pointer)&local_120._variant_part.field_2;
          local_120._variant_part._M_string_length = 0;
          local_120._variant_part.field_2._M_local_buf[0] = '\0';
          local_120._variant_selection_part._M_dataplus._M_p =
               (pointer)&local_120._variant_selection_part.field_2;
          local_120._variant_selection_part._M_string_length = 0;
          local_120._variant_selection_part.field_2._M_local_buf[0] = '\0';
          local_120._variant_part_str._M_dataplus._M_p =
               (pointer)&local_120._variant_part_str.field_2;
          local_120._variant_part_str._M_string_length = 0;
          local_120._variant_part_str.field_2._M_local_buf[0] = '\0';
          local_120._element._M_string_length = 0;
          local_120._element.field_2._M_local_buf[0] = '\0';
          local_120._path_type.has_value_ = false;
          local_120._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
          local_120._valid = false;
          local_120._prim_part._M_dataplus._M_p = (pointer)paVar8;
          local_120._element._M_dataplus._M_p = (pointer)paVar1;
          bVar5 = ReadBasicType(this,&local_120);
          iVar7 = 3;
          if (bVar5) {
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back
                      (result,&local_120);
            iVar7 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._element._M_dataplus._M_p != paVar1) {
            operator_delete(local_120._element._M_dataplus._M_p,
                            CONCAT71(local_120._element.field_2._M_allocated_capacity._1_7_,
                                     local_120._element.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._variant_part_str._M_dataplus._M_p !=
              &local_120._variant_part_str.field_2) {
            operator_delete(local_120._variant_part_str._M_dataplus._M_p,
                            CONCAT71(local_120._variant_part_str.field_2._M_allocated_capacity._1_7_
                                     ,local_120._variant_part_str.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._variant_selection_part._M_dataplus._M_p !=
              &local_120._variant_selection_part.field_2) {
            operator_delete(local_120._variant_selection_part._M_dataplus._M_p,
                            CONCAT71(local_120._variant_selection_part.field_2._M_allocated_capacity
                                     ._1_7_,local_120._variant_selection_part.field_2._M_local_buf
                                            [0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._variant_part._M_dataplus._M_p != &local_120._variant_part.field_2) {
            operator_delete(local_120._variant_part._M_dataplus._M_p,
                            CONCAT71(local_120._variant_part.field_2._M_allocated_capacity._1_7_,
                                     local_120._variant_part.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._prop_part._M_dataplus._M_p != &local_120._prop_part.field_2) {
            operator_delete(local_120._prop_part._M_dataplus._M_p,
                            CONCAT71(local_120._prop_part.field_2._M_allocated_capacity._1_7_,
                                     local_120._prop_part.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._prim_part._M_dataplus._M_p != paVar8) {
            operator_delete(local_120._prim_part._M_dataplus._M_p,
                            CONCAT71(local_120._prim_part.field_2._M_allocated_capacity._1_7_,
                                     local_120._prim_part.field_2._M_local_buf[0]) + 1);
          }
        }
      } while (iVar7 == 0);
      if (iVar7 != 1) {
LAB_003bdef8:
        if ((result->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (result->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          return true;
        }
        local_120._prim_part._M_dataplus._M_p = (pointer)paVar8;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Empty array.\n","");
        PushError(this,&local_120._prim_part);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._prim_part._M_dataplus._M_p != paVar8) {
          operator_delete(local_120._prim_part._M_dataplus._M_p,
                          CONCAT71(local_120._prim_part.field_2._M_allocated_capacity._1_7_,
                                   local_120._prim_part.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}